

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_connect(SessionHandle *data,connectdata **in_connect,_Bool *asyncp,
                     _Bool *protocol_done)

{
  ssl_config_data *dest;
  hostname *conn;
  undefined1 auVar1 [16];
  byte bVar2;
  uint uVar3;
  Curl_handler *pCVar4;
  unsigned_long uVar5;
  conncache *pcVar6;
  size_t sVar7;
  size_t sVar8;
  curl_llist_element *pcVar9;
  void *pvVar10;
  Curl_HttpReq CVar11;
  char cVar12;
  _Bool _Var13;
  unsigned_short uVar14;
  int iVar15;
  CURLcode CVar16;
  connectdata *pcVar17;
  char *pcVar18;
  curl_llist *pcVar19;
  size_t sVar20;
  size_t sVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  ulong uVar25;
  byte *__haystack;
  ushort **ppuVar26;
  char **ppcVar27;
  Curl_handler *pCVar28;
  hostname *host;
  hostname *host_00;
  hostname *host_01;
  curl_proxytype cVar29;
  Curl_handler **ppCVar30;
  long lVar31;
  SessionHandle *pSVar32;
  byte *__s;
  byte *__s_00;
  bool bVar33;
  _Bool _Var34;
  undefined1 auVar35 [16];
  timeval tVar36;
  connectdata *local_490;
  char *local_480;
  connectdata *local_450;
  Curl_handler *local_448;
  char protobuf [16];
  char passwd [256];
  char user [256];
  char endbracket;
  undefined7 uStack_137;
  undefined1 local_39;
  
  *asyncp = false;
  CVar16 = CURLE_URL_MALFORMAT;
  if ((data->change).url == (char *)0x0) goto LAB_0011b489;
  pcVar17 = (connectdata *)(*Curl_ccalloc)(1,0x590);
  CVar16 = CURLE_OUT_OF_MEMORY;
  if (pcVar17 == (connectdata *)0x0) goto LAB_0011b489;
  pcVar17->handler = &Curl_handler_dummy;
  pcVar17->sock[0] = -1;
  pcVar17->sock[1] = -1;
  pcVar17->connectindex = -1;
  pcVar17->port = -1;
  (pcVar17->bits).close = true;
  tVar36 = curlx_tvnow();
  pcVar17->created = tVar36;
  pcVar17->data = data;
  cVar29 = (data->set).proxytype;
  pcVar17->proxytype = cVar29;
  pcVar18 = (data->set).str[0x10];
  if (pcVar18 == (char *)0x0) {
    (pcVar17->bits).proxy = false;
LAB_0011b2c6:
    _Var34 = false;
  }
  else {
    bVar33 = *pcVar18 == '\0';
    (pcVar17->bits).proxy = !bVar33;
    if (bVar33) goto LAB_0011b2c6;
    if (cVar29 == CURLPROXY_HTTP) {
      _Var34 = true;
    }
    else {
      _Var34 = cVar29 == CURLPROXY_HTTP_1_0;
    }
  }
  (pcVar17->bits).httpproxy = _Var34;
  (pcVar17->bits).proxy_user_passwd = (data->set).str[0x1e] != (char *)0x0;
  (pcVar17->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (pcVar17->bits).user_passwd = (data->set).str[0x1c] != (char *)0x0;
  (pcVar17->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (pcVar17->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  pcVar17->verifypeer = (data->set).ssl.verifypeer;
  pcVar17->verifyhost = (data->set).ssl.verifyhost;
  pcVar17->ip_version = (data->set).ipver;
  if (((data->multi == (Curl_multi *)0x0) || (_Var34 = Curl_multi_canPipeline(data->multi), !_Var34)
      ) || (pcVar17->master_buffer != (char *)0x0)) {
LAB_0011b37f:
    pcVar19 = Curl_llist_alloc(llist_dtor);
    pcVar17->send_pipe = pcVar19;
    pcVar19 = Curl_llist_alloc(llist_dtor);
    pcVar17->recv_pipe = pcVar19;
    pcVar19 = Curl_llist_alloc(llist_dtor);
    pcVar17->pend_pipe = pcVar19;
    pcVar19 = Curl_llist_alloc(llist_dtor);
    pcVar17->done_pipe = pcVar19;
    if (((pcVar17->send_pipe == (curl_llist *)0x0) || (pcVar17->recv_pipe == (curl_llist *)0x0)) ||
       (pcVar19 == (curl_llist *)0x0 || pcVar17->pend_pipe == (curl_llist *)0x0)) goto LAB_0011b3ef;
    pcVar18 = (data->set).str[5];
    if (pcVar18 != (char *)0x0) {
      pcVar18 = (*Curl_cstrdup)(pcVar18);
      pcVar17->localdev = pcVar18;
      if (pcVar18 == (char *)0x0) goto LAB_0011b3ef;
    }
    pcVar17->localportrange = (data->set).localportrange;
    pcVar17->localport = (data->set).localport;
    pvVar10 = (data->set).closesocket_client;
    pcVar17->fclosesocket = (data->set).fclosesocket;
    pcVar17->closesocket_client = pvVar10;
    *in_connect = pcVar17;
    sVar20 = strlen((data->change).url);
    sVar21 = 0x100;
    if (0x100 < sVar20) {
      sVar21 = sVar20;
    }
    pcVar18 = (data->state).pathbuffer;
    if (pcVar18 != (char *)0x0) {
      (*Curl_cfree)(pcVar18);
      (data->state).pathbuffer = (char *)0x0;
    }
    (data->state).path = (char *)0x0;
    pcVar18 = (char *)(*Curl_cmalloc)(sVar21 + 2);
    (data->state).pathbuffer = pcVar18;
    if (pcVar18 != (char *)0x0) {
      (data->state).path = pcVar18;
      pcVar18 = (char *)(*Curl_cmalloc)(sVar21 + 2);
      (pcVar17->host).rawalloc = pcVar18;
      if (pcVar18 == (char *)0x0) {
        pcVar18 = (data->state).pathbuffer;
        if (pcVar18 != (char *)0x0) {
          (*Curl_cfree)(pcVar18);
          (data->state).pathbuffer = (char *)0x0;
        }
        (data->state).path = (char *)0x0;
      }
      else {
        (pcVar17->host).name = pcVar18;
        *pcVar18 = '\0';
        pcVar18 = (data->state).path;
        iVar15 = __isoc99_sscanf((data->change).url,"%15[^:]:%[^\n]",protobuf);
        if (iVar15 == 2) {
          local_480 = "file";
          iVar15 = Curl_raw_equal(protobuf,"file");
          if (iVar15 == 0) goto LAB_0011b677;
          if (*pcVar18 == '/') {
            if (pcVar18[1] == '/') {
              sVar21 = strlen(pcVar18 + 2);
              memmove(pcVar18,pcVar18 + 2,sVar21 + 1);
              if (*pcVar18 != '/') goto LAB_0011b62e;
            }
          }
          else {
LAB_0011b62e:
            pcVar22 = strchr(pcVar18,0x2f);
            if (pcVar22 != (char *)0x0) {
              pcVar24 = pcVar22 + 1;
              if (pcVar22[1] != '/') {
                pcVar24 = pcVar22;
              }
              sVar21 = strlen(pcVar24);
              memmove(pcVar18,pcVar24,sVar21 + 1);
            }
          }
          bVar33 = false;
        }
        else {
LAB_0011b677:
          *pcVar18 = '\0';
          iVar15 = __isoc99_sscanf((data->change).url,"%15[^\n:]://%[^\n/?]%[^\n]",protobuf);
          local_480 = protobuf;
          bVar33 = false;
          if (iVar15 < 2) {
            iVar15 = __isoc99_sscanf((data->change).url,"%[^\n/?]%[^\n]",(pcVar17->host).name,
                                     pcVar18);
            if (iVar15 < 1) {
              Curl_failf(data,"<url> malformed");
              CVar16 = CURLE_URL_MALFORMAT;
              goto LAB_0011b489;
            }
            iVar15 = Curl_raw_nequal("FTP.",(pcVar17->host).name,4);
            bVar33 = true;
            if (iVar15 == 0) {
              iVar15 = Curl_raw_nequal("DICT.",(pcVar17->host).name,5);
              if (iVar15 == 0) {
                iVar15 = Curl_raw_nequal("LDAP.",(pcVar17->host).name,5);
                if (iVar15 == 0) {
                  iVar15 = Curl_raw_nequal("IMAP.",(pcVar17->host).name,5);
                  local_480 = "IMAP";
                  bVar33 = true;
                  if (iVar15 == 0) {
                    local_480 = "http";
                  }
                }
                else {
                  local_480 = "LDAP";
                }
              }
              else {
                local_480 = "DICT";
              }
            }
            else {
              local_480 = "ftp";
            }
          }
        }
        pcVar22 = (pcVar17->host).name;
        pcVar23 = strchr(pcVar22,0x40);
        pcVar24 = pcVar23 + 1;
        if (pcVar23 == (char *)0x0) {
          pcVar24 = pcVar22;
        }
        pcVar22 = strchr(pcVar24,0x3f);
        if (pcVar22 == (char *)0x0) {
          cVar12 = *pcVar18;
          if (cVar12 != '\0') goto LAB_0011b825;
          pcVar18[0] = '/';
          pcVar18[1] = '\0';
        }
        else {
          sVar21 = strlen(pcVar22);
          sVar20 = strlen(pcVar18);
          memmove(pcVar18 + sVar21 + 1,pcVar18,sVar20 + 1);
          memcpy(pcVar18 + 1,pcVar22,sVar21);
          *pcVar18 = '/';
          *pcVar22 = '\0';
          cVar12 = *pcVar18;
LAB_0011b825:
          if (cVar12 == '?') {
            sVar21 = strlen(pcVar18);
            memmove(pcVar18 + 1,pcVar18,sVar21 + 1);
            *pcVar18 = '/';
          }
        }
        pcVar22 = (pcVar17->host).name;
        pcVar24 = strchr(pcVar22,0x40);
        user[0] = '\0';
        passwd[0] = '\0';
        if (pcVar24 != (char *)0x0) {
          (pcVar17->host).name = pcVar24 + 1;
          (pcVar17->bits).userpwd_in_url = true;
          if ((data->set).use_netrc != CURL_NETRC_REQUIRED) {
            (pcVar17->bits).user_passwd = true;
            if (*pcVar22 == ':') {
              __isoc99_sscanf(pcVar22,":%255[^@]",passwd);
            }
            else {
              __isoc99_sscanf(pcVar22,"%255[^:@]:%255[^@]",user);
            }
            if (user[0] != '\0') {
              pcVar22 = curl_easy_unescape(data,user,0,(int *)0x0);
              if (pcVar22 != (char *)0x0) {
                sVar21 = strlen(pcVar22);
                if (sVar21 < 0x100) {
                  strcpy(user,pcVar22);
                }
                (*Curl_cfree)(pcVar22);
                goto LAB_0011b93c;
              }
LAB_0011bc71:
              CVar16 = CURLE_OUT_OF_MEMORY;
              goto LAB_0011b489;
            }
LAB_0011b93c:
            if (passwd[0] != '\0') {
              pcVar22 = curl_easy_unescape(data,passwd,0,(int *)0x0);
              if (pcVar22 == (char *)0x0) goto LAB_0011bc71;
              sVar21 = strlen(pcVar22);
              if (sVar21 < 0x100) {
                strcpy(passwd,pcVar22);
              }
              (*Curl_cfree)(pcVar22);
            }
          }
        }
        pcVar22 = (pcVar17->host).name;
        if ((*pcVar22 == '[') && (pcVar22 = strstr(pcVar22,"%25"), pcVar22 != (char *)0x0)) {
          uVar25 = strtoul(pcVar22 + 3,(char **)&endbracket,10);
          pcVar24 = (char *)CONCAT71(uStack_137,endbracket);
          if (*pcVar24 == ']') {
            sVar21 = strlen(pcVar24);
            memmove(pcVar22,pcVar24,sVar21 + 1);
            if ((data->state).this_is_a_follow == false) {
              pcVar17->scope = (uint)uVar25;
            }
          }
          else {
            Curl_infof(data,"Invalid IPv6 address format\n");
          }
        }
        uVar3 = (data->set).scope;
        if (uVar3 != 0) {
          pcVar17->scope = uVar3;
        }
        pcVar18 = strchr(pcVar18,0x23);
        if (pcVar18 != (char *)0x0) {
          *pcVar18 = '\0';
          pcVar18 = strchr((data->change).url,0x23);
          if (pcVar18 != (char *)0x0) {
            *pcVar18 = '\0';
          }
        }
        ppCVar30 = protocols;
        do {
          pCVar28 = *ppCVar30;
          if (pCVar28 == (Curl_handler *)0x0) goto LAB_0011bc54;
          iVar15 = Curl_raw_equal(pCVar28->scheme,local_480);
          ppCVar30 = ppCVar30 + 1;
        } while (iVar15 == 0);
        if ((((uint)(data->set).allowed_protocols & pCVar28->protocol) == 0) ||
           (((data->state).this_is_a_follow == true &&
            (((uint)(data->set).redir_protocols & pCVar28->protocol) == 0)))) {
LAB_0011bc54:
          Curl_failf(data,"Protocol %s not supported or disabled in libcurl",local_480);
          CVar16 = CURLE_UNSUPPORTED_PROTOCOL;
          goto LAB_0011b489;
        }
        pcVar17->given = pCVar28;
        pcVar17->handler = pCVar28;
        if (bVar33) {
          pcVar18 = curl_maprintf("%s://%s",pCVar28->scheme,(data->change).url);
          if (pcVar18 == (char *)0x0) goto LAB_0011b483;
          if (((data->change).url_alloc == true) &&
             (pcVar22 = (data->change).url, pcVar22 != (char *)0x0)) {
            (*Curl_cfree)(pcVar22);
          }
          (data->change).url = pcVar18;
          (data->change).url_alloc = true;
          pCVar28 = pcVar17->given;
        }
        if (((pCVar28->flags & 0x40) != 0) &&
           (pcVar18 = strchr((pcVar17->data->state).path,0x3f), pcVar18 != (char *)0x0)) {
          *pcVar18 = '\0';
        }
        if ((pcVar17->bits).proxy_user_passwd != true) {
LAB_0011bc20:
          pcVar18 = (data->set).str[0x10];
          if (pcVar18 == (char *)0x0) {
            __haystack = (byte *)0x0;
          }
          else {
            __haystack = (byte *)(*Curl_cstrdup)(pcVar18);
            if (__haystack == (byte *)0x0) {
              Curl_failf(data,"memory shortage");
              goto LAB_0011b483;
            }
          }
          pcVar18 = (data->set).str[0x20];
          if ((pcVar18 == (char *)0x0) ||
             (_Var34 = check_noproxy((pcVar17->host).name,pcVar18), !_Var34)) {
            if (__haystack == (byte *)0x0) {
              pcVar18 = curl_getenv("no_proxy");
              if (pcVar18 == (char *)0x0) {
                pcVar18 = curl_getenv("NO_PROXY");
              }
              _Var34 = check_noproxy((pcVar17->host).name,pcVar18);
              if (_Var34) {
                __haystack = (byte *)0x0;
              }
              else {
                pcVar22 = pcVar17->handler->scheme;
                for (lVar31 = 0; cVar12 = pcVar22[lVar31], cVar12 != '\0'; lVar31 = lVar31 + 1) {
                  iVar15 = tolower((int)cVar12);
                  protobuf[lVar31] = (char)iVar15;
                }
                builtin_strncpy(protobuf + lVar31,"_proxy",7);
                __haystack = (byte *)curl_getenv(protobuf);
                if (__haystack == (byte *)0x0) {
                  iVar15 = Curl_raw_equal("http_proxy",protobuf);
                  if (iVar15 == 0) {
                    Curl_strntoupper(protobuf,protobuf,0x80);
                    __haystack = (byte *)curl_getenv(protobuf);
                    if (__haystack != (byte *)0x0) goto LAB_0011bd60;
                  }
                }
                else {
LAB_0011bd60:
                  if (*__haystack != 0) goto LAB_0011bda6;
                }
                __haystack = (byte *)curl_getenv("all_proxy");
                if (__haystack == (byte *)0x0) {
                  __haystack = (byte *)curl_getenv("ALL_PROXY");
                }
              }
LAB_0011bda6:
              if (pcVar18 != (char *)0x0) {
                (*Curl_cfree)(pcVar18);
              }
              if (__haystack == (byte *)0x0) goto LAB_0011be23;
            }
            if ((*__haystack == 0) || ((pcVar17->handler->flags & 0x10) != 0)) goto LAB_0011be17;
            pcVar18 = strstr((char *)__haystack,"://");
            __s = __haystack;
            if (pcVar18 != (char *)0x0) {
              __s = (byte *)(pcVar18 + 3);
              iVar15 = Curl_raw_nequal("socks5h",(char *)__haystack,7);
              if (iVar15 == 0) {
                iVar15 = Curl_raw_nequal("socks5",(char *)__haystack,6);
                if (iVar15 == 0) {
                  iVar15 = Curl_raw_nequal("socks4a",(char *)__haystack,7);
                  if (iVar15 == 0) {
                    iVar15 = Curl_raw_nequal("socks4",(char *)__haystack,6);
                    cVar29 = CURLPROXY_SOCKS4;
                    if ((iVar15 == 0) &&
                       (iVar15 = Curl_raw_nequal("socks",(char *)__haystack,5), iVar15 == 0))
                    goto LAB_0011c17f;
                  }
                  else {
                    cVar29 = CURLPROXY_SOCKS4A;
                  }
                }
                else {
                  cVar29 = CURLPROXY_SOCKS5;
                }
              }
              else {
                cVar29 = CURLPROXY_SOCKS5_HOSTNAME;
              }
              pcVar17->proxytype = cVar29;
            }
LAB_0011c17f:
            pcVar18 = strchr((char *)__s,0x40);
            if (pcVar18 == (char *)0x0) {
LAB_0011c248:
              __s_00 = __s;
              if (*__s == 0x5b) {
                __s_00 = __s + 1;
                __s = __s_00;
                while( true ) {
                  bVar2 = *__s;
                  uVar25 = (ulong)bVar2;
                  if (uVar25 == 0) break;
                  ppuVar26 = __ctype_b_loc();
                  if ((((((*ppuVar26)[uVar25] >> 0xc & 1) == 0) && (uVar25 != 0x25)) &&
                      (bVar2 != 0x2e)) && (bVar2 != 0x3a)) {
                    if (bVar2 == 0x5d) {
                      *__s = 0;
                      __s = __s + 1;
                      goto LAB_0011c2ac;
                    }
                    break;
                  }
                  __s = __s + 1;
                }
                Curl_infof(data,"Invalid IPv6 address format\n");
              }
LAB_0011c2ac:
              pcVar18 = strchr((char *)__s,0x3a);
              if (pcVar18 == (char *)0x0) {
                if (*__s_00 == 0x2f) {
                  CVar16 = CURLE_COULDNT_RESOLVE_PROXY;
                  goto LAB_0011c309;
                }
                pcVar18 = strchr((char *)__s_00,0x2f);
                if (pcVar18 != (char *)0x0) {
                  *pcVar18 = '\0';
                }
                lVar31 = (data->set).proxyport;
                if (lVar31 != 0) goto LAB_0011c2cf;
              }
              else {
                *pcVar18 = '\0';
                lVar31 = strtol(pcVar18 + 1,(char **)0x0,10);
LAB_0011c2cf:
                pcVar17->port = lVar31;
              }
              pcVar18 = (*Curl_cstrdup)((char *)__s_00);
              (pcVar17->proxy).rawalloc = pcVar18;
              (pcVar17->proxy).name = pcVar18;
              CVar16 = CURLE_OUT_OF_MEMORY;
              if (pcVar18 != (char *)0x0) {
                CVar16 = CURLE_OK;
              }
            }
            else {
              endbracket = '\0';
              iVar15 = __isoc99_sscanf(__s,"%255[^:@]:%255[^@]",protobuf);
              if (iVar15 < 1) goto LAB_0011c248;
              if (pcVar17->proxyuser != (char *)0x0) {
                (*Curl_cfree)(pcVar17->proxyuser);
                pcVar17->proxyuser = (char *)0x0;
              }
              pcVar22 = curl_easy_unescape(data,protobuf,0,(int *)0x0);
              pcVar17->proxyuser = pcVar22;
              if (pcVar22 != (char *)0x0) {
                if (pcVar17->proxypasswd != (char *)0x0) {
                  (*Curl_cfree)(pcVar17->proxypasswd);
                  pcVar17->proxypasswd = (char *)0x0;
                }
                pcVar22 = curl_easy_unescape(data,&endbracket,0,(int *)0x0);
                pcVar17->proxypasswd = pcVar22;
                if (pcVar22 != (char *)0x0) {
                  (pcVar17->bits).proxy_user_passwd = true;
                  __s = (byte *)(pcVar18 + 1);
                  goto LAB_0011c248;
                }
              }
              CVar16 = CURLE_OUT_OF_MEMORY;
            }
LAB_0011c309:
            (*Curl_cfree)(__haystack);
            if (CVar16 != CURLE_OK) goto LAB_0011b489;
            if (pcVar17->proxytype < 2) {
              _Var34 = true;
              if (((pcVar17->handler->protocol & 1) == 0) && ((pcVar17->bits).tunnel_proxy == false)
                 ) {
                pcVar17->handler = &Curl_handler_http;
              }
            }
            else {
              _Var34 = false;
            }
            (pcVar17->bits).httpproxy = _Var34;
            (pcVar17->bits).proxy = true;
            bVar33 = false;
          }
          else {
            if (__haystack != (byte *)0x0) {
LAB_0011be17:
              (*Curl_cfree)(__haystack);
            }
LAB_0011be23:
            (pcVar17->bits).proxy = false;
            (pcVar17->bits).httpproxy = false;
            __haystack = (byte *)0x0;
            (pcVar17->bits).proxy_user_passwd = false;
            (pcVar17->bits).tunnel_proxy = false;
            bVar33 = true;
          }
          pcVar17->socktype = 1;
          pCVar28 = pcVar17->handler;
          if (pCVar28->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
            CVar16 = (*pCVar28->setup_connection)(pcVar17);
            if (CVar16 != CURLE_OK) {
              if (!bVar33) {
                (*Curl_cfree)(__haystack);
              }
              goto LAB_0011b489;
            }
            pCVar28 = pcVar17->handler;
          }
          if (pcVar17->port < 0) {
            pcVar17->port = pCVar28->defport;
          }
          pCVar4 = pcVar17->given;
          pcVar17->remote_port = (unsigned_short)pCVar4->defport;
          pcVar17->recv[0] = Curl_recv_plain;
          pcVar17->send[0] = Curl_send_plain;
          pcVar17->recv[1] = Curl_recv_plain;
          pcVar17->send[1] = Curl_send_plain;
          if ((pCVar28->flags & 0x10) == 0) {
            if (((pCVar4->flags & 1) != 0) && ((pcVar17->bits).httpproxy == true)) {
              (pcVar17->bits).tunnel_proxy = true;
            }
            iVar15 = __isoc99_sscanf((pcVar17->host).name,"[%*45[0123456789abcdefABCDEF:.]%c",
                                     &endbracket);
            if ((iVar15 == 1) && (endbracket == ']')) {
              (pcVar17->bits).ipv6_ip = true;
              pcVar18 = (pcVar17->host).name + 1;
              (pcVar17->host).name = pcVar18;
              pcVar22 = strchr(pcVar18,0x5d);
              if (pcVar22 == (char *)0x0) {
                pcVar18 = (char *)0x0;
              }
              else {
                *pcVar22 = '\0';
                pcVar18 = (char *)0x0;
                if (pcVar22[1] == ':') {
                  pcVar18 = pcVar22 + 1;
                }
              }
            }
            else {
              pcVar18 = strrchr((pcVar17->host).name,0x3a);
            }
            lVar31 = (data->set).use_port;
            if ((lVar31 == 0) || ((data->state).allow_port != true)) {
              if (pcVar18 != (char *)0x0) {
                uVar25 = strtoul(pcVar18 + 1,(char **)protobuf,10);
                if (((char *)protobuf._0_8_ == pcVar18 + 1) || (*(char *)protobuf._0_8_ != '\0')) {
                  if (uVar25 == 0) {
                    *pcVar18 = '\0';
                  }
                }
                else {
                  if (0xffff < uVar25) {
                    Curl_failf(data,"Port number too large: %lu",uVar25);
                    CVar16 = CURLE_URL_MALFORMAT;
                    goto LAB_0011b489;
                  }
                  *pcVar18 = '\0';
                  uVar14 = curlx_ultous(uVar25);
                  pcVar17->remote_port = uVar14;
                }
              }
            }
            else {
              pcVar17->remote_port = (unsigned_short)lVar31;
              if (pcVar18 != (char *)0x0) {
                *pcVar18 = '\0';
              }
              if ((pcVar17->bits).httpproxy == true) {
                protobuf[8] = '\0';
                protobuf[9] = '\0';
                protobuf[10] = '\0';
                protobuf[0xb] = '\0';
                protobuf[0] = '\0';
                protobuf[1] = '\0';
                protobuf[2] = '\0';
                protobuf[3] = '\0';
                protobuf[4] = '\0';
                protobuf[5] = '\0';
                protobuf[6] = '\0';
                protobuf[7] = '\0';
                if ((pcVar17->bits).type_set == true) {
                  if ((data->set).prefer_ascii == false) {
                    uVar25 = (ulong)(((data->set).ftp_list_only ^ 1) * 5 + 0x44);
                  }
                  else {
                    uVar25 = 0x41;
                  }
                  curl_msnprintf(protobuf,0xc,";type=%c",uVar25);
                }
                pcVar18 = "[";
                bVar33 = (pcVar17->bits).ipv6_ip == false;
                if (bVar33) {
                  pcVar18 = "";
                }
                pcVar22 = "]";
                if (bVar33) {
                  pcVar22 = "";
                }
                pcVar24 = "/";
                if ((data->state).slash_removed == false) {
                  pcVar24 = "";
                }
                pcVar18 = curl_maprintf("%s://%s%s%s:%hu%s%s%s",pcVar17->given->scheme,pcVar18,
                                        (pcVar17->host).name,pcVar22,(ulong)pcVar17->remote_port,
                                        pcVar24,(data->state).path,protobuf);
                if (pcVar18 == (char *)0x0) goto LAB_0011b483;
                if (((data->change).url_alloc == true) &&
                   (pcVar22 = (data->change).url, pcVar22 != (char *)0x0)) {
                  (*Curl_cfree)(pcVar22);
                }
                (data->change).url = pcVar18;
                (data->change).url_alloc = true;
              }
            }
            pcVar18 = (data->set).str[0x1c];
            if (pcVar18 != (char *)0x0) {
              strncpy(user,pcVar18,0x100);
              user[0xff] = '\0';
            }
            pcVar18 = (data->set).str[0x1d];
            if (pcVar18 != (char *)0x0) {
              strncpy(passwd,pcVar18,0x100);
              passwd[0xff] = '\0';
            }
            (pcVar17->bits).netrc = false;
            if ((data->set).use_netrc != CURL_NETRC_IGNORED) {
              iVar15 = Curl_parsenetrc((pcVar17->host).name,user,passwd,(data->set).str[0xe]);
              if (iVar15 == 0) {
                (pcVar17->bits).netrc = true;
                (pcVar17->bits).user_passwd = true;
              }
              else {
                Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                           (pcVar17->host).name);
              }
            }
            if (((pcVar17->handler->flags & 0x20) == 0) || ((pcVar17->bits).user_passwd != false)) {
              pcVar18 = (*Curl_cstrdup)(user);
              pcVar17->user = pcVar18;
              if (pcVar18 == (char *)0x0) goto LAB_0011cb96;
              pcVar18 = passwd;
            }
            else {
              pcVar18 = (*Curl_cstrdup)("anonymous");
              pcVar17->user = pcVar18;
              if (pcVar18 == (char *)0x0) {
LAB_0011cb96:
                pcVar17->passwd = (char *)0x0;
                goto LAB_0011b483;
              }
              pcVar18 = "ftp@example.com";
            }
            pcVar18 = (*Curl_cstrdup)(pcVar18);
            pcVar17->passwd = pcVar18;
            if (pcVar18 == (char *)0x0 || pcVar17->user == (char *)0x0) goto LAB_0011b483;
            pcVar18 = (data->set).str[0x15];
            (data->set).ssl.CApath = (data->set).str[0x14];
            (data->set).ssl.CAfile = pcVar18;
            pcVar18 = (data->set).str[0x1b];
            (data->set).ssl.CRLfile = (data->set).str[0x1a];
            (data->set).ssl.issuercert = pcVar18;
            auVar1 = *(undefined1 (*) [16])((data->set).str + 0x17);
            auVar35._0_8_ = auVar1._8_8_;
            auVar35._8_4_ = auVar1._0_4_;
            auVar35._12_4_ = auVar1._4_4_;
            (data->set).ssl.random_file = (char *)auVar35._0_8_;
            (data->set).ssl.egdsocket = (char *)auVar35._8_8_;
            (data->set).ssl.cipher_list = (data->set).str[0x16];
            dest = &pcVar17->ssl_config;
            _Var34 = Curl_clone_ssl_config(&(data->set).ssl,dest);
            CVar16 = CURLE_OUT_OF_MEMORY;
            if (!_Var34) goto LAB_0011b489;
            if (((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)) {
LAB_0011ce86:
              ConnectionStore(data,pcVar17);
            }
            else {
              ppcVar27 = &pcVar17->user;
              _Var34 = IsPipeliningPossible(data,pcVar17);
              uVar5 = (data->state).authhost.want;
              local_450 = (connectdata *)0x0;
              for (lVar31 = 0; pcVar6 = (data->state).connc, lVar31 < pcVar6->num;
                  lVar31 = lVar31 + 1) {
                local_490 = pcVar6->connects[lVar31];
                if (local_490 != (connectdata *)0x0) {
                  pcVar19 = local_490->send_pipe;
                  sVar7 = pcVar19->size;
                  sVar8 = local_490->recv_pipe->size;
                  if (local_490->connectindex == -1) {
                    local_490->connectindex = lVar31;
                  }
                  if (sVar7 + sVar8 == 0) {
                    if (local_490->inuse == false) {
                      if ((local_490->handler->protocol & 0x40000) == 0) {
                        iVar15 = Curl_socket_check(local_490->sock[0],-1,-1,0);
                        if (iVar15 != 0) {
LAB_0011ca22:
                          local_490->data = data;
                          Curl_infof(data,"Connection #%ld seems to be dead!\n",lVar31);
                          Curl_disconnect(local_490,true);
                          ((data->state).connc)->connects[lVar31] = (connectdata *)0x0;
                          goto LAB_0011ca57;
                        }
                      }
                      else {
                        _Var13 = Curl_rtsp_connisdead(local_490);
                        if (_Var13) goto LAB_0011ca22;
                      }
                    }
                    if (_Var34) {
                      pcVar19 = local_490->send_pipe;
LAB_0011c73a:
                      if (pcVar19->head == (curl_llist_element *)0x0) {
                        pSVar32 = (SessionHandle *)0x0;
                      }
                      else {
                        pSVar32 = (SessionHandle *)pcVar19->head->ptr;
                      }
                      pcVar9 = local_490->recv_pipe->head;
                      if (pcVar9 == (curl_llist_element *)0x0) {
LAB_0011c7c2:
                        if (pSVar32 == (SessionHandle *)0x0) goto LAB_0011c7dd;
                      }
                      else if (pSVar32 == (SessionHandle *)0x0) {
                        pSVar32 = (SessionHandle *)pcVar9->ptr;
                        goto LAB_0011c7c2;
                      }
                      _Var13 = IsPipeliningPossible(pSVar32,local_490);
                      if (!_Var13) goto LAB_0011ca57;
                    }
                    else if ((local_490->sock[0] == -1) || ((local_490->bits).close == true)) {
                      Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse\n",
                                 local_490->connectindex);
                      goto LAB_0011ca57;
                    }
LAB_0011c7dd:
                    pCVar28 = pcVar17->handler;
                    uVar3 = pCVar28->flags;
                    local_448 = local_490->handler;
                    if (((((((local_448->flags ^ uVar3) & 1) == 0) ||
                          ((pCVar28->protocol & local_448->protocol) != 0)) &&
                         (((uVar3 & 1) == 0 ||
                          (((data->set).ssl.verifypeer == local_490->verifypeer &&
                           ((data->set).ssl.verifyhost == local_490->verifyhost)))))) &&
                        ((pcVar17->bits).proxy == (local_490->bits).proxy)) &&
                       ((_Var34 || (local_490->inuse == false)))) {
                      pcVar18 = pcVar17->localdev;
                      if ((pcVar18 == (char *)0x0 && pcVar17->localport == 0) ||
                         ((((local_490->localport == pcVar17->localport &&
                            (local_490->localportrange == pcVar17->localportrange)) &&
                           (pcVar18 != (char *)0x0)) &&
                          ((local_490->localdev != (char *)0x0 &&
                           (iVar15 = strcmp(local_490->localdev,pcVar18), iVar15 == 0)))))) {
                        if (((uVar3 & 1) == 0) && ((pcVar17->bits).httpproxy != false)) {
                          if (((((local_490->bits).httpproxy == true) &&
                               ((pcVar17->bits).tunnel_proxy == true)) &&
                              ((local_490->bits).tunnel_proxy == true)) &&
                             ((iVar15 = Curl_raw_equal((pcVar17->proxy).name,(local_490->proxy).name
                                                      ), iVar15 != 0 &&
                              (pcVar17->port == local_490->port)))) {
                            pCVar28 = pcVar17->handler;
                            local_448 = local_490->handler;
                            goto LAB_0011c8fe;
                          }
                          if (((((local_490->bits).proxy != true) ||
                               (pcVar17->proxytype != local_490->proxytype)) ||
                              ((pcVar17->bits).tunnel_proxy != (local_490->bits).tunnel_proxy)) ||
                             ((iVar15 = Curl_raw_equal((pcVar17->proxy).name,(local_490->proxy).name
                                                      ), iVar15 == 0 ||
                              (pcVar17->port != local_490->port)))) goto LAB_0011ca57;
LAB_0011cb18:
                          bVar33 = false;
LAB_0011cb1a:
                          if (((uVar5 != 0x20) && (uVar5 != 8)) ||
                             ((local_450 = local_490, bVar33 &&
                              ((local_490->ntlm).state != NTLMSTATE_NONE)))) goto LAB_0011cbb6;
                        }
                        else {
LAB_0011c8fe:
                          iVar15 = Curl_raw_equal(pCVar28->scheme,local_448->scheme);
                          if ((((iVar15 != 0) ||
                               ((pcVar17->handler->protocol & local_490->handler->protocol) != 0))
                              && (iVar15 = Curl_raw_equal((pcVar17->host).name,
                                                          (local_490->host).name), iVar15 != 0)) &&
                             (pcVar17->remote_port == local_490->remote_port)) {
                            pCVar28 = pcVar17->handler;
                            if ((pCVar28->flags & 1) != 0) {
                              _Var13 = Curl_ssl_config_matches(dest,&local_490->ssl_config);
                              if ((!_Var13) || (local_490->ssl[0].state != ssl_connection_complete))
                              goto LAB_0011ca57;
                              pCVar28 = pcVar17->handler;
                            }
                            if (((pCVar28->protocol & 4) == 0) &&
                               (((pCVar28->protocol & 1) == 0 || ((uVar5 != 0x20 && (uVar5 != 8)))))
                               ) goto LAB_0011cb18;
                            iVar15 = curl_strequal(*ppcVar27,local_490->user);
                            if (iVar15 != 0) {
                              iVar15 = curl_strequal(pcVar17->passwd,local_490->passwd);
                              bVar33 = true;
                              if (iVar15 != 0) goto LAB_0011cb1a;
                            }
                          }
                        }
                      }
                    }
                  }
                  else if (_Var34) goto LAB_0011c73a;
                }
LAB_0011ca57:
              }
              local_490 = local_450;
              if (local_450 == (connectdata *)0x0) goto LAB_0011ce86;
LAB_0011cbb6:
              local_490->inuse = true;
              pcVar18 = (pcVar17->proxy).rawalloc;
              if (pcVar18 != (char *)0x0) {
                (*Curl_cfree)(pcVar18);
              }
              Curl_free_ssl_config(dest);
              local_490->data = pcVar17->data;
              _Var34 = (pcVar17->bits).user_passwd;
              (local_490->bits).user_passwd = _Var34;
              if (_Var34 == true) {
                if (local_490->user != (char *)0x0) {
                  (*Curl_cfree)(local_490->user);
                  local_490->user = (char *)0x0;
                }
                if (local_490->passwd != (char *)0x0) {
                  (*Curl_cfree)(local_490->passwd);
                  local_490->passwd = (char *)0x0;
                }
                pcVar18 = pcVar17->passwd;
                local_490->user = *ppcVar27;
                local_490->passwd = pcVar18;
                pcVar17->user = (char *)0x0;
                pcVar17->passwd = (char *)0x0;
              }
              _Var34 = (pcVar17->bits).proxy_user_passwd;
              (local_490->bits).proxy_user_passwd = _Var34;
              if (_Var34 == true) {
                if (local_490->proxyuser != (char *)0x0) {
                  (*Curl_cfree)(local_490->proxyuser);
                  local_490->proxyuser = (char *)0x0;
                }
                if (local_490->proxypasswd != (char *)0x0) {
                  (*Curl_cfree)(local_490->proxypasswd);
                  local_490->proxypasswd = (char *)0x0;
                }
                pcVar18 = pcVar17->proxypasswd;
                local_490->proxyuser = pcVar17->proxyuser;
                local_490->proxypasswd = pcVar18;
                pcVar17->proxyuser = (char *)0x0;
                pcVar17->proxypasswd = (char *)0x0;
              }
              conn = &local_490->host;
              pcVar18 = (local_490->host).rawalloc;
              if (pcVar18 != (char *)0x0) {
                (*Curl_cfree)(pcVar18);
                conn->rawalloc = (char *)0x0;
              }
              pcVar18 = (pcVar17->host).rawalloc;
              pcVar22 = (pcVar17->host).encalloc;
              pcVar24 = (pcVar17->host).dispname;
              (local_490->host).name = (pcVar17->host).name;
              (local_490->host).dispname = pcVar24;
              conn->rawalloc = pcVar18;
              (local_490->host).encalloc = pcVar22;
              Curl_persistconninfo(local_490);
              (local_490->bits).reuse = true;
              if (*ppcVar27 != (char *)0x0) {
                (*Curl_cfree)(*ppcVar27);
                *ppcVar27 = (char *)0x0;
              }
              if (pcVar17->passwd != (char *)0x0) {
                (*Curl_cfree)(pcVar17->passwd);
                pcVar17->passwd = (char *)0x0;
              }
              if (pcVar17->proxyuser != (char *)0x0) {
                (*Curl_cfree)(pcVar17->proxyuser);
                pcVar17->proxyuser = (char *)0x0;
              }
              if (pcVar17->proxypasswd != (char *)0x0) {
                (*Curl_cfree)(pcVar17->proxypasswd);
                pcVar17->proxypasswd = (char *)0x0;
              }
              if (pcVar17->localdev != (char *)0x0) {
                (*Curl_cfree)(pcVar17->localdev);
                pcVar17->localdev = (char *)0x0;
              }
              Curl_llist_destroy(pcVar17->send_pipe,(void *)0x0);
              Curl_llist_destroy(pcVar17->recv_pipe,(void *)0x0);
              Curl_llist_destroy(pcVar17->pend_pipe,(void *)0x0);
              Curl_llist_destroy(pcVar17->done_pipe,(void *)0x0);
              pcVar17->pend_pipe = (curl_llist *)0x0;
              pcVar17->done_pipe = (curl_llist *)0x0;
              pcVar17->send_pipe = (curl_llist *)0x0;
              pcVar17->recv_pipe = (curl_llist *)0x0;
              if (pcVar17->master_buffer != (char *)0x0) {
                (*Curl_cfree)(pcVar17->master_buffer);
                pcVar17->master_buffer = (char *)0x0;
              }
              (*Curl_cfree)(pcVar17);
              *in_connect = local_490;
              fix_hostname(data,(connectdata *)conn,host);
              Curl_infof(data,"Re-using existing connection! (#%ld) with host %s\n",
                         local_490->connectindex,
                         *(undefined8 *)
                          (local_490->primary_ip +
                          (ulong)((local_490->proxy).name != (char *)0x0) * 0x20 + -0x32));
              pcVar17 = local_490;
            }
            pSVar32 = pcVar17->data;
            (pcVar17->bits).done = false;
            (pcVar17->bits).do_more = false;
            (pSVar32->state).expect100header = false;
            if ((pSVar32->set).opt_no_body == false) {
              if ((pSVar32->set).httpreq == HTTPREQ_HEAD) {
                CVar11 = HTTPREQ_GET;
                goto LAB_0011cec8;
              }
            }
            else {
              CVar11 = HTTPREQ_HEAD;
LAB_0011cec8:
              (pSVar32->set).httpreq = CVar11;
            }
            Curl_easy_initHandleData(pSVar32);
            tVar36 = curlx_tvnow();
            (pSVar32->req).start = tVar36;
            (pSVar32->req).now.tv_sec = (pSVar32->req).start.tv_sec;
            (pSVar32->req).now.tv_usec = (pSVar32->req).start.tv_usec;
            (pSVar32->req).header = true;
            (pSVar32->req).bytecount = 0;
            (pSVar32->req).buf = (pSVar32->state).buffer;
            (pSVar32->req).uploadbuf = (pSVar32->state).uploadbuffer;
            (pSVar32->req).hbufp = (pSVar32->state).headerbuff;
            (pSVar32->req).ignorebody = false;
            Curl_speedinit(pSVar32);
            Curl_pgrsSetUploadCounter(pSVar32,0);
            Curl_pgrsSetDownloadCounter(pSVar32,0);
            CVar16 = setup_range(data);
            if (CVar16 != CURLE_OK) goto LAB_0011b489;
            pcVar17->fread_func = (data->set).fread_func;
            pcVar17->fread_in = (data->set).in;
            pcVar17->seek_func = (data->set).seek_func;
            pcVar17->seek_client = (data->set).seek_client;
            lVar31 = Curl_timeleft(data,(timeval *)0x0,true);
            if ((pcVar17->bits).reuse != true) {
              fix_hostname(data,(connectdata *)&pcVar17->host,host_00);
              pcVar18 = (pcVar17->proxy).name;
              if ((pcVar18 == (char *)0x0) || (*pcVar18 == '\0')) {
                pcVar17->port = (ulong)pcVar17->remote_port;
                iVar15 = Curl_resolv_timeout(pcVar17,(pcVar17->host).name,(uint)pcVar17->remote_port
                                             ,(Curl_dns_entry **)protobuf,lVar31);
                if (iVar15 == -2) goto LAB_0011d0d4;
                if (iVar15 == 1) goto LAB_0011d0ca;
                if (protobuf._0_8_ != 0) goto LAB_0011d0e2;
                CVar16 = CURLE_COULDNT_RESOLVE_HOST;
                Curl_failf(data,"Couldn\'t resolve host \'%s\'",(pcVar17->host).dispname);
              }
              else {
                fix_hostname(data,(connectdata *)&pcVar17->proxy,host_01);
                iVar15 = Curl_resolv_timeout(pcVar17,(pcVar17->proxy).name,(int)pcVar17->port,
                                             (Curl_dns_entry **)protobuf,lVar31);
                if (iVar15 == -2) {
LAB_0011d0d4:
                  CVar16 = CURLE_OPERATION_TIMEDOUT;
                }
                else {
                  if (iVar15 == 1) {
LAB_0011d0ca:
                    *asyncp = true;
                  }
                  else if (protobuf._0_8_ == 0) {
                    Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",(pcVar17->proxy).dispname);
                    CVar16 = CURLE_COULDNT_RESOLVE_PROXY;
                    goto LAB_0011d0e5;
                  }
LAB_0011d0e2:
                  CVar16 = CURLE_OK;
                }
              }
LAB_0011d0e5:
              pcVar17->dns_entry = (Curl_dns_entry *)protobuf._0_8_;
              goto LAB_0011c0d2;
            }
            *asyncp = false;
          }
          else {
            CVar16 = (*pCVar28->connect_it)(pcVar17,(_Bool *)protobuf);
            if (CVar16 == CURLE_OK) {
              pcVar17->data = data;
              (pcVar17->bits).tcpconnect[0] = true;
              ConnectionStore(data,pcVar17);
              CVar16 = setup_range(data);
              if (CVar16 == CURLE_OK) {
                CVar16 = CURLE_OK;
                Curl_setup_transfer(pcVar17,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
              }
              else {
                (*pcVar17->handler->done)(pcVar17,CVar16,false);
              }
            }
LAB_0011c0d2:
            if (CVar16 != CURLE_OK) goto LAB_0011b489;
          }
          pcVar17 = *in_connect;
          if ((pcVar17->send_pipe->size != 0) || (pcVar17->recv_pipe->size != 0)) {
            *protocol_done = true;
            return CURLE_OK;
          }
          if (*asyncp != false) {
            return CURLE_OK;
          }
          CVar16 = Curl_setup_conn(pcVar17,protocol_done);
          if (CVar16 == CURLE_OK) {
            return CURLE_OK;
          }
          goto LAB_0011b489;
        }
        memset(protobuf,0,0x100);
        memset(&endbracket,0,0x100);
        pcVar18 = (data->set).str[0x1e];
        if (pcVar18 != (char *)0x0) {
          strncpy(protobuf,pcVar18,0x100);
        }
        pcVar18 = (data->set).str[0x1f];
        if (pcVar18 != (char *)0x0) {
          strncpy(&endbracket,pcVar18,0x100);
          local_39 = 0;
        }
        pcVar18 = curl_easy_unescape(data,protobuf,0,(int *)0x0);
        pcVar17->proxyuser = pcVar18;
        if (pcVar18 != (char *)0x0) {
          pcVar18 = curl_easy_unescape(data,&endbracket,0,(int *)0x0);
          pcVar17->proxypasswd = pcVar18;
          if (pcVar18 != (char *)0x0) goto LAB_0011bc20;
        }
      }
    }
  }
  else {
    pcVar18 = (char *)(*Curl_ccalloc)(0x4000,1);
    pcVar17->master_buffer = pcVar18;
    if (pcVar18 != (char *)0x0) goto LAB_0011b37f;
LAB_0011b3ef:
    Curl_llist_destroy(pcVar17->send_pipe,(void *)0x0);
    Curl_llist_destroy(pcVar17->recv_pipe,(void *)0x0);
    Curl_llist_destroy(pcVar17->pend_pipe,(void *)0x0);
    Curl_llist_destroy(pcVar17->done_pipe,(void *)0x0);
    pcVar17->pend_pipe = (curl_llist *)0x0;
    pcVar17->done_pipe = (curl_llist *)0x0;
    pcVar17->send_pipe = (curl_llist *)0x0;
    pcVar17->recv_pipe = (curl_llist *)0x0;
    if (pcVar17->master_buffer != (char *)0x0) {
      (*Curl_cfree)(pcVar17->master_buffer);
      pcVar17->master_buffer = (char *)0x0;
    }
    if (pcVar17->localdev != (char *)0x0) {
      (*Curl_cfree)(pcVar17->localdev);
      pcVar17->localdev = (char *)0x0;
    }
    (*Curl_cfree)(pcVar17);
  }
LAB_0011b483:
  CVar16 = CURLE_OUT_OF_MEMORY;
LAB_0011b489:
  if (*in_connect != (connectdata *)0x0) {
    Curl_disconnect(*in_connect,false);
    *in_connect = (connectdata *)0x0;
  }
  return CVar16;
}

Assistant:

CURLcode Curl_connect(struct SessionHandle *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode code;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  code = create_conn(data, in_connect, asyncp);

  if(CURLE_OK == code) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      code = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(code && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return code;
}